

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall
CGraphics_Threaded::QuadsSetSubset
          (CGraphics_Threaded *this,float TlU,float TlV,float BrU,float BrV,int TextureIndex)

{
  int iVar1;
  undefined4 uVar2;
  int in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  float fVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(char *)0x12fc9a);
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))();
  if ((1 < iVar1) && (-1 < in_ESI)) {
    TilesetFallbackSystem
              ((CGraphics_Threaded *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20));
  }
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x1201a8);
  *(undefined4 *)(in_RDI + 0x1200e4) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x1200f0) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 0x1200e8) = in_XMM1_Da;
  *(undefined4 *)(in_RDI + 0x1200f4) = in_XMM1_Da;
  *(undefined4 *)(in_RDI + 0x120108) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x1200fc) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 0x12010c) = in_XMM3_Da;
  *(undefined4 *)(in_RDI + 0x120100) = in_XMM3_Da;
  fVar3 = (float)in_ESI + 0.5;
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))();
  fVar3 = fVar3 / (256.0 / (float)iVar1);
  *(float *)(in_RDI + 0x120110) = fVar3;
  *(float *)(in_RDI + 0x120104) = fVar3;
  *(float *)(in_RDI + 0x1200f8) = fVar3;
  *(float *)(in_RDI + 0x1200ec) = fVar3;
  uVar2 = 3;
  if (in_ESI < 0) {
    uVar2 = 2;
  }
  *(undefined4 *)(in_RDI + 0x38) = uVar2;
  return;
}

Assistant:

void CGraphics_Threaded::QuadsSetSubset(float TlU, float TlV, float BrU, float BrV, int TextureIndex)
{
	dbg_assert(m_Drawing == DRAWING_QUADS, "called Graphics()->QuadsSetSubset without begin");

	// tileset fallback system
	if(m_pBackend->GetTextureArraySize() > 1 && TextureIndex >= 0)
		TilesetFallbackSystem(TextureIndex);

	m_State.m_TextureArrayIndex = m_TextureArrayIndex;

	m_aTexture[0].u = TlU;	m_aTexture[1].u = BrU;
	m_aTexture[0].v = TlV;	m_aTexture[1].v = TlV;

	m_aTexture[3].u = TlU;	m_aTexture[2].u = BrU;
	m_aTexture[3].v = BrV;	m_aTexture[2].v = BrV;

	m_aTexture[0].i = m_aTexture[1].i = m_aTexture[2].i = m_aTexture[3].i = (0.5f + TextureIndex) / (256.0f/m_pBackend->GetTextureArraySize());
	m_State.m_Dimension = (TextureIndex < 0) ? 2 : 3;
}